

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O1

void write_zip(char *zipname,dir_tree_t *trees,int update)

{
  bool bVar1;
  bool bVar2;
  dir_tree_s **ppdVar3;
  int iVar4;
  dir_tree_s *pdVar5;
  file_sorted_t *__ptr;
  FILE *__stream;
  BYTE *odir;
  FILE *__stream_00;
  long lVar6;
  size_t sVar7;
  file_entry_t *pfVar8;
  file_sorted_t *pfVar9;
  uint num_files;
  char *__filename;
  ulong uVar10;
  EndOfCentralDirectory dirend;
  char tempname [4096];
  undefined8 local_1050;
  undefined2 local_1048;
  undefined2 local_1046;
  int local_1044;
  int local_1040;
  undefined2 local_103c;
  char local_1038 [4104];
  
  num_files = 0;
  pdVar5 = trees;
  if (trees != (dir_tree_t *)0x0) {
    do {
      pfVar8 = (file_entry_t *)&pdVar5->files;
      num_files = num_files - 1;
      do {
        pfVar8 = pfVar8->next;
        num_files = num_files + 1;
      } while (pfVar8 != (file_entry_t *)0x0);
      ppdVar3 = &pdVar5->next;
      pdVar5 = *ppdVar3;
    } while (*ppdVar3 != (dir_tree_s *)0x0);
  }
  __ptr = sort_files(trees,num_files);
  if (__ptr == (file_sorted_t *)0x0) {
    no_mem = 1;
  }
  else {
    bVar1 = true;
    if (update == 0) {
      __stream = (FILE *)0x0;
      odir = (BYTE *)0x0;
    }
    else {
      sprintf(local_1038,"%s.temp",zipname);
      __stream = fopen(zipname,"rb");
      if (__stream == (FILE *)0x0) {
        write_zip_cold_1();
        bVar2 = true;
        odir = (BYTE *)0x0;
      }
      else {
        odir = find_central_dir((FILE *)__stream);
        if (odir == (BYTE *)0x0) {
          odir = (BYTE *)0x0;
          fprintf(_stderr,"Could not read central directory from %s. (Is it a zipfile?)\n",zipname);
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
      }
      if (bVar2) {
        write_zip_cold_2();
      }
      else {
        bVar1 = false;
      }
    }
    __filename = zipname;
    if (!bVar1) {
      __filename = local_1038;
    }
    __stream_00 = fopen(__filename,"wb");
    if (__stream_00 == (FILE *)0x0) {
      write_zip_cold_6();
    }
    else {
      uVar10 = 0;
      pfVar9 = __ptr;
      if (0 < (int)num_files) {
        do {
          iVar4 = append_to_zip((FILE *)__stream_00,pfVar9,(FILE *)__stream,odir);
          if (iVar4 != 0) goto LAB_00103ab5;
          uVar10 = uVar10 + 1;
          pfVar9 = pfVar9 + 1;
        } while (num_files != uVar10);
        uVar10 = (ulong)num_files;
      }
LAB_00103ab5:
      if ((uint)uVar10 == num_files) {
        lVar6 = ftell(__stream_00);
        iVar4 = (int)lVar6;
        uVar10 = 0;
        pfVar9 = __ptr;
        local_1040 = iVar4;
        if (0 < (int)num_files) {
          do {
            write_central_dir((FILE *)__stream_00,pfVar9);
            uVar10 = uVar10 + 1;
            pfVar9 = pfVar9 + 1;
          } while (num_files != uVar10);
        }
        local_1050 = 0x6054b50;
        local_1048 = (undefined2)uVar10;
        local_1046 = local_1048;
        lVar6 = ftell(__stream_00);
        local_1044 = (int)lVar6 - iVar4;
        local_103c = 0;
        sVar7 = fwrite(&local_1050,0x16,1,__stream_00);
        if (sVar7 != 1) {
          write_zip_cold_3();
        }
        printf("%s contains %d files (updated %d)\n",zipname,(ulong)num_files,
               (ulong)(uint)UpdateCount);
        fclose(__stream_00);
        if (__stream != (FILE *)0x0) {
          fclose(__stream);
          iVar4 = remove(zipname);
          if (iVar4 == 0) {
            iVar4 = rename(local_1038,zipname);
            if (iVar4 != 0) {
              write_zip_cold_5();
            }
          }
          else {
            write_zip_cold_4();
          }
        }
        __stream = (FILE *)0x0;
      }
    }
    free(__ptr);
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    if (odir != (BYTE *)0x0) {
      free(odir);
    }
  }
  return;
}

Assistant:

void write_zip(const char *zipname, dir_tree_t *trees, int update)
{
#ifdef _WIN32
	char tempname[_MAX_PATH];
#else
	char tempname[PATH_MAX];
#endif
	EndOfCentralDirectory dirend;
	int i, num_files;
	file_sorted_t *sorted;
	FILE *zip, *ozip = NULL;
	void *central_dir = NULL;

	num_files = count_files(trees);
	sorted = sort_files(trees, num_files);
	if (sorted == NULL)
	{
		no_mem = 1;
		return;
	}
	if (update)
	{
		sprintf(tempname, "%s.temp", zipname);
		ozip = fopen(zipname, "rb");
		if (ozip == NULL)
		{
			fprintf(stderr, "Could not open %s for updating: %s\n", zipname, strerror(errno));
			update = 0;
		}
		else
		{
			central_dir = find_central_dir(ozip);
			if (central_dir == NULL)
			{
				fprintf(stderr, "Could not read central directory from %s. (Is it a zipfile?)\n", zipname);
				update = 0;
			}
		}
		if (!update)
		{
			fprintf(stderr, "Will proceed as if -u had not been specified.\n");
		}
	}
	if (update)
	{
		zip = fopen(tempname, "wb");
	}
	else
	{
		zip = fopen(zipname, "wb");
	}
	if (zip == NULL)
	{
		fprintf(stderr, "Could not open %s: %s\n", zipname, strerror(errno));
	}
	else
	{
		// Write each file.
		for (i = 0; i < num_files; ++i)
		{
			if (append_to_zip(zip, sorted + i, ozip, central_dir))
			{
				break;
			}
		}
		if (i == num_files)
		{
			// Write central directory.
			dirend.DirectoryOffset = LittleLong(ftell(zip));
			for (i = 0; i < num_files; ++i)
			{
				write_central_dir(zip, sorted + i);
			}
			// Write the directory terminator.
			dirend.Magic = ZIP_ENDOFDIR;
			dirend.DiskNumber = 0;
			dirend.FirstDisk = 0;
			dirend.NumEntriesOnAllDisks = dirend.NumEntries = LittleShort(i);
			// In this case LittleLong(dirend.DirectoryOffset) is undoing the transformation done above.
			dirend.DirectorySize = LittleLong(ftell(zip) - LittleLong(dirend.DirectoryOffset));
			dirend.ZipCommentLength = 0;
			if (fwrite(&dirend, sizeof(dirend), 1, zip) != 1)
			{
				fprintf(stderr, "Failed writing zip directory terminator: %s\n", strerror(errno));
			}
			printf("%s contains %d files (updated %d)\n", zipname, num_files, UpdateCount);
			fclose(zip);

			if (ozip != NULL)
			{
				// Delete original, and rename temp to take its place
				fclose(ozip);
				ozip = NULL;
				if (remove(zipname))
				{
					fprintf(stderr, "Could not delete old zip: %s\nUpdated zip can be found at %s\n",
						strerror(errno), tempname);
				}
				else if (rename(tempname, zipname))
				{
					fprintf(stderr, "Could not rename %s to %s: %s\n",
						tempname, zipname, strerror(errno));
				}
			}
		}
	}
	free(sorted);
	if (ozip != NULL)
	{
		fclose(ozip);
	}
	if (central_dir != NULL)
	{
		free(central_dir);
	}
}